

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O0

monster_race * get_mon_num(wchar_t generated_level,wchar_t current_level)

{
  alloc_entry *paVar1;
  _Bool _Var2;
  uint32_t uVar3;
  tm *ptVar4;
  uint local_5c;
  monster_race *old_1;
  monster_race *old;
  tm *date;
  time_t cur_time;
  alloc_entry *table;
  monster_race *race;
  long total;
  wchar_t p;
  wchar_t i;
  wchar_t current_level_local;
  wchar_t generated_level_local;
  
  cur_time = (time_t)alloc_race_table;
  p = current_level;
  i = generated_level;
  date = (tm *)time((time_t *)0x0);
  ptVar4 = localtime((time_t *)&date);
  if ((L'\0' < i) && (uVar3 = Rand_div((uint)z_info->ood_monster_chance), uVar3 == 0)) {
    if ((int)(uint)z_info->ood_monster_amount < i / 4 + 2) {
      local_5c = (uint)z_info->ood_monster_amount;
    }
    else {
      local_5c = i / 4 + 2;
    }
    i = local_5c + i;
  }
  race = (monster_race *)0x0;
  total._4_4_ = 0;
  while ((total._4_4_ < alloc_race_size &&
         (*(wchar_t *)(cur_time + (long)total._4_4_ * 0x14 + 4) <= i))) {
    *(undefined4 *)(cur_time + (long)total._4_4_ * 0x14 + 0x10) = 0;
    if ((i < L'\x01') || (0 < *(int *)(cur_time + (long)total._4_4_ * 0x14 + 4))) {
      table = (alloc_entry *)(r_info + *(int *)(cur_time + (long)total._4_4_ * 0x14));
      _Var2 = flag_has_dbg(((monster_race *)table)->flags,0xb,0xf,"race->flags","RF_SEASONAL");
      if ((((!_Var2) ||
           (((ptVar4->tm_mon == 0xb && (0x17 < ptVar4->tm_mday)) && (ptVar4->tm_mday < 0x1b)))) &&
          ((_Var2 = flag_has_dbg((bitflag *)&table[4].prob2,0xb,1,"race->flags","RF_UNIQUE"), !_Var2
           || (table[7].prob1 < (int)(uint)(byte)table[7].level)))) &&
         ((_Var2 = flag_has_dbg((bitflag *)&table[4].prob2,0xb,0xc,"race->flags","RF_FORCE_DEPTH"),
          !_Var2 || (table[6].prob1 <= p)))) {
        *(undefined4 *)(cur_time + (long)total._4_4_ * 0x14 + 0x10) =
             *(undefined4 *)(cur_time + (long)total._4_4_ * 0x14 + 0xc);
        race = (monster_race *)
               (race->flags + (long)*(int *)(cur_time + (long)total._4_4_ * 0x14 + 0x10) + -0x5c);
      }
    }
    total._4_4_ = total._4_4_ + 1;
  }
  if ((long)race < 1) {
    _current_level_local = (monster_race *)0x0;
  }
  else {
    table = (alloc_entry *)get_mon_race_aux((long)race,(alloc_entry *)cur_time);
    total._0_4_ = Rand_div(100);
    paVar1 = table;
    table = paVar1;
    if (((int)(uint32_t)total < 0x3c) &&
       (table = (alloc_entry *)get_mon_race_aux((long)race,(alloc_entry *)cur_time),
       ((monster_race *)table)->level < paVar1[6].prob1)) {
      table = paVar1;
    }
    paVar1 = table;
    table = paVar1;
    if (((int)(uint32_t)total < 10) &&
       (table = (alloc_entry *)get_mon_race_aux((long)race,(alloc_entry *)cur_time),
       ((monster_race *)table)->level < paVar1[6].prob1)) {
      table = paVar1;
    }
    _current_level_local = (monster_race *)table;
  }
  return _current_level_local;
}

Assistant:

struct monster_race *get_mon_num(int generated_level, int current_level)
{
	int i, p;
	long total;
	struct monster_race *race;
	alloc_entry *table = alloc_race_table;
	time_t cur_time = time(NULL);
	struct tm *date = localtime(&cur_time);

	/* Occasionally produce a nastier monster in the dungeon */
	if (generated_level > 0 && one_in_(z_info->ood_monster_chance))
		generated_level += MIN(generated_level / 4 + 2,
			z_info->ood_monster_amount);

	total = 0L;

	/* Process probabilities */
	for (i = 0; i < alloc_race_size; i++) {
		/* Monsters are sorted by depth */
		if (table[i].level > generated_level) break;

		/* Default */
		table[i].prob3 = 0;

		/* No town monsters in dungeon */
		if (generated_level > 0 && table[i].level <= 0) continue;

		/* Get the chosen monster */
		race = &r_info[table[i].index];

		/* No seasonal monsters outside of Christmas */
		if (rf_has(race->flags, RF_SEASONAL) &&
			!(date->tm_mon == 11 && date->tm_mday >= 24 && date->tm_mday <= 26))
			continue;

		/* Only one copy of a unique must be around at the same time */
		if (rf_has(race->flags, RF_UNIQUE) && (race->cur_num >= race->max_num))
			continue;

		/* Some monsters never appear out of depth */
		if (rf_has(race->flags, RF_FORCE_DEPTH) && race->level > current_level)
			continue;

		/* Accept */
		table[i].prob3 = table[i].prob2;

		/* Total */
		total += table[i].prob3;
	}

	/* No legal monsters */
	if (total <= 0) return NULL;

	/* Pick a monster */
	race = get_mon_race_aux(total, table);

	/* Try for a "harder" monster once (50%) or twice (10%) */
	p = randint0(100);

	if (p < 60) {
		struct monster_race *old = race;

		/* Pick a new monster */
		race = get_mon_race_aux(total, table);

		/* Keep the deepest one */
		if (race->level < old->level) race = old;
	}

	/* Try for a "harder" monster twice (10%) */
	if (p < 10) {
		struct monster_race *old = race;

		/* Pick a monster */
		race = get_mon_race_aux(total, table);

		/* Keep the deepest one */
		if (race->level < old->level) race = old;
	}

	/* Result */
	return race;
}